

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  IConfig *pIVar4;
  long in_RSI;
  long in_RDI;
  Colour colour;
  SectionStats *in_stack_ffffffffffffffb8;
  StreamingReporterBase *in_stack_ffffffffffffffc0;
  
  if ((*(byte *)(in_RSI + 0x90) & 1) != 0) {
    lazyPrint((ConsoleReporter *)in_stack_ffffffffffffffc0);
    Colour::Colour((Colour *)in_stack_ffffffffffffffc0,
                   (Code)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                      ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                       (in_RDI + 0x1b0));
    if (sVar2 < 2) {
      std::operator<<(*(ostream **)(in_RDI + 0x18),"\nNo assertions in test case");
    }
    else {
      std::operator<<(*(ostream **)(in_RDI + 0x18),"\nNo assertions in section");
    }
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18)," \'");
    in_stack_ffffffffffffffc0 =
         (StreamingReporterBase *)std::operator<<(poVar3,(string *)(in_RSI + 8));
    in_stack_ffffffffffffffb8 =
         (SectionStats *)std::operator<<((ostream *)in_stack_ffffffffffffffc0,"\'\n");
    std::ostream::operator<<(in_stack_ffffffffffffffb8,std::endl<char,std::char_traits<char>>);
    Colour::~Colour((Colour *)0x1b7af2);
  }
  if ((*(byte *)(in_RDI + 0x1c9) & 1) == 0) {
    pIVar4 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
    iVar1 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
    if (iVar1 == 1) {
      poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),(string *)(in_RSI + 8));
      poVar3 = std::operator<<(poVar3," completed in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RSI + 0x88));
      poVar3 = std::operator<<(poVar3,"s");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    pIVar4 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
    iVar1 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
    if (iVar1 == 1) {
      poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Completed in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RSI + 0x88));
      poVar3 = std::operator<<(poVar3,"s");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    *(undefined1 *)(in_RDI + 0x1c9) = 0;
  }
  StreamingReporterBase::sectionEnded(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& _sectionStats ) CATCH_OVERRIDE {
            if( _sectionStats.missingAssertions ) {
                lazyPrint();
                Colour colour( Colour::ResultError );
                if( m_sectionStack.size() > 1 )
                    stream << "\nNo assertions in section";
                else
                    stream << "\nNo assertions in test case";
                stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
            }
            if( m_headerPrinted ) {
                if( m_config->showDurations() == ShowDurations::Always )
                    stream << "Completed in " << _sectionStats.durationInSeconds << "s" << std::endl;
                m_headerPrinted = false;
            }
            else {
                if( m_config->showDurations() == ShowDurations::Always )
                    stream << _sectionStats.sectionInfo.name << " completed in " << _sectionStats.durationInSeconds << "s" << std::endl;
            }
            StreamingReporterBase::sectionEnded( _sectionStats );
        }